

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void __thiscall logging_tests::LogSetup::~LogSetup(LogSetup *this)

{
  string_view source_file;
  Logger *pLVar1;
  long in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  Level in_stack_000000e0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff3c;
  path *in_stack_ffffffffffffff40;
  path *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar3;
  undefined7 in_stack_ffffffffffffff70;
  byte bVar4;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffa8;
  int source_line;
  ConstevalFormatString<0U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar5;
  
  source_line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pcVar5 = *(char **)(in_FS_OFFSET + 0x28);
  LogInstance();
  fs::path::operator=(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  uVar2 = 2;
  source_file._M_str = pcVar5;
  source_file._M_len = in_stack_fffffffffffffff0;
  LogPrintFormatInternal<>
            (in_stack_00000000,source_file,source_line,
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_stack_000000e0,
             in_stack_ffffffffffffffe8);
  bVar4 = *(byte *)(in_RDI + 0x489);
  pLVar1 = LogInstance();
  pLVar1->m_print_to_file = (bool)(bVar4 & 1);
  LogInstance();
  std::atomic<bool>::operator=((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff3c,uVar2),false);
  bVar4 = *(byte *)(in_RDI + 0x48a);
  pLVar1 = LogInstance();
  pLVar1->m_log_timestamps = (bool)(bVar4 & 1);
  bVar4 = *(byte *)(in_RDI + 0x48b);
  pLVar1 = LogInstance();
  pLVar1->m_log_threadnames = (bool)(bVar4 & 1);
  bVar3 = *(byte *)(in_RDI + 0x48c);
  pLVar1 = LogInstance();
  pLVar1->m_log_sourcelocations = (bool)(bVar3 & 1);
  pLVar1 = LogInstance();
  BCLog::Logger::SetLogLevel((Logger *)CONCAT44(in_stack_ffffffffffffff3c,uVar2),Trace);
  LogInstance();
  BCLog::Logger::SetCategoryLogLevel
            ((Logger *)CONCAT17(bVar3,in_stack_ffffffffffffff60),
             (unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
              *)pLVar1);
  std::
  unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
  ::~unordered_map((unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffff3c,uVar2));
  BasicTestingSetup::~BasicTestingSetup
            ((BasicTestingSetup *)CONCAT17(bVar4,in_stack_ffffffffffffff70));
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~LogSetup()
    {
        LogInstance().m_file_path = prev_log_path;
        LogPrintf("Sentinel log to reopen log file\n");
        LogInstance().m_print_to_file = prev_print_to_file;
        LogInstance().m_reopen_file = prev_reopen_file;
        LogInstance().m_log_timestamps = prev_log_timestamps;
        LogInstance().m_log_threadnames = prev_log_threadnames;
        LogInstance().m_log_sourcelocations = prev_log_sourcelocations;
        LogInstance().SetLogLevel(prev_log_level);
        LogInstance().SetCategoryLogLevel(prev_category_levels);
    }